

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils-inl.hpp
# Opt level: O1

void CoreMLConverter::unsupportedCaffeParrameter
               (string *parameterName,string *layerName,string *layerType)

{
  ostream *poVar1;
  runtime_error *this;
  stringstream ss;
  string local_1d0 [32];
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"Unsupported parameter \'",0x17);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a0,(parameterName->_M_dataplus)._M_p,parameterName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\' in caffe layer \'",0x12);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(layerName->_M_dataplus)._M_p,layerName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\' of type \'",0xb);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(layerType->_M_dataplus)._M_p,layerType->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'.",2);
  std::endl<char,std::char_traits<char>>(poVar1);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,local_1d0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void unsupportedCaffeParrameter(const std::string& parameterName,
                                    const std::string& layerName,
                                    const std::string& layerType) {
        
        std::stringstream ss;
        ss << "Unsupported parameter '" << parameterName << "' in caffe layer '"
           << layerName  << "' of type '"<< layerType << "'." << std::endl;
        throw std::runtime_error(ss.str());
    }